

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_reflection_class.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::csharp::ReflectionClassGenerator::WriteGeneratedCodeInfo
          (ReflectionClassGenerator *this,Descriptor *descriptor,Printer *printer,bool last)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ReflectionClassGenerator *this_00;
  ulong uVar2;
  undefined7 in_register_00000009;
  string *psVar3;
  string *delim;
  string *psVar4;
  string *psVar5;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  EnumDescriptor *extraout_RDX_02;
  EnumDescriptor *extraout_RDX_03;
  EnumDescriptor *extraout_RDX_04;
  EnumDescriptor *descriptor_00;
  FieldDescriptor *extraout_RDX_05;
  FieldDescriptor *extraout_RDX_06;
  FieldDescriptor *extraout_RDX_07;
  FieldDescriptor *extraout_RDX_08;
  FieldDescriptor *pFVar6;
  long lVar7;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fields;
  string local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  Printer *local_48;
  undefined4 local_3c;
  ReflectionClassGenerator *local_38;
  
  delim = &local_88;
  psVar3 = &local_88;
  psVar4 = &local_88;
  psVar5 = &local_88;
  if (*(char *)(*(long *)(descriptor + 0x20) + 0x4b) == '\0') {
    local_3c = (undefined4)CONCAT71(in_register_00000009,last);
    local_38 = this;
    GetClassName_abi_cxx11_(&local_88,(csharp *)descriptor,(Descriptor *)printer);
    io::Printer::Print<char[10],std::__cxx11::string>
              (printer,"new pbr::GeneratedClrTypeInfo(typeof($type_name$), $type_name$.Parser, ",
               (char (*) [10])0x3b0aa0,&local_88);
    paVar1 = &local_88.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    local_48 = printer;
    if ((long)*(int *)(descriptor + 0x68) < 1) {
      io::Printer::Print<>(printer,"null, ");
    }
    else {
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve(&local_68,(long)*(int *)(descriptor + 0x68));
      if (0 < *(int *)(descriptor + 0x68)) {
        lVar9 = 0;
        lVar7 = 0;
        pFVar6 = extraout_RDX;
        do {
          GetPropertyName_abi_cxx11_
                    (&local_88,(csharp *)(*(long *)(descriptor + 0x28) + lVar9),pFVar6);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_68,
                     &local_88);
          pFVar6 = extraout_RDX_00;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != paVar1) {
            operator_delete(local_88._M_dataplus._M_p);
            pFVar6 = extraout_RDX_01;
          }
          lVar7 = lVar7 + 1;
          lVar9 = lVar9 + 0x98;
        } while (lVar7 < *(int *)(descriptor + 0x68));
      }
      Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&local_88,(protobuf *)&local_68,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)"\", \"",(char *)delim);
      printer = local_48;
      io::Printer::Print<char[7],std::__cxx11::string>
                (local_48,"new[]{ \"$fields$\" }, ",(char (*) [7])0x3edf8b,&local_88);
      delim = psVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar1) {
        operator_delete(local_88._M_dataplus._M_p);
        delim = psVar3;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
    }
    if ((long)*(int *)(descriptor + 0x6c) < 1) {
      io::Printer::Print<>(printer,"null, ");
    }
    else {
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve(&local_68,(long)*(int *)(descriptor + 0x6c));
      if (0 < *(int *)(descriptor + 0x6c)) {
        lVar9 = 0;
        lVar7 = 0;
        do {
          delim = (string *)0x0;
          UnderscoresToCamelCase
                    (&local_88,*(string **)(*(long *)(descriptor + 0x30) + lVar9),true,false);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_68,
                     &local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != paVar1) {
            operator_delete(local_88._M_dataplus._M_p);
          }
          lVar7 = lVar7 + 1;
          lVar9 = lVar9 + 0x30;
        } while (lVar7 < *(int *)(descriptor + 0x6c));
      }
      Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&local_88,(protobuf *)&local_68,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)"\", \"",(char *)delim);
      printer = local_48;
      io::Printer::Print<char[7],std::__cxx11::string>
                (local_48,"new[]{ \"$oneofs$\" }, ",(char (*) [7])"oneofs",&local_88);
      delim = psVar4;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar1) {
        operator_delete(local_88._M_dataplus._M_p);
        delim = psVar4;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
    }
    if ((long)*(int *)(descriptor + 0x74) < 1) {
      io::Printer::Print<>(printer,"null, ");
      pFVar6 = extraout_RDX_06;
    }
    else {
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve(&local_68,(long)*(int *)(descriptor + 0x74));
      if (0 < *(int *)(descriptor + 0x74)) {
        lVar9 = 0;
        lVar7 = 0;
        descriptor_00 = extraout_RDX_02;
        do {
          GetClassName_abi_cxx11_
                    (&local_88,(csharp *)(*(long *)(descriptor + 0x40) + lVar9),descriptor_00);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_68,
                     &local_88);
          descriptor_00 = extraout_RDX_03;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != paVar1) {
            operator_delete(local_88._M_dataplus._M_p);
            descriptor_00 = extraout_RDX_04;
          }
          lVar7 = lVar7 + 1;
          lVar9 = lVar9 + 0x50;
        } while (lVar7 < *(int *)(descriptor + 0x74));
      }
      Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&local_88,(protobuf *)&local_68,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)"), typeof(",(char *)delim);
      printer = local_48;
      io::Printer::Print<char[6],std::__cxx11::string>
                (local_48,"new[]{ typeof($enums$) }, ",(char (*) [6])0x39e9f1,&local_88);
      delim = psVar5;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar1) {
        operator_delete(local_88._M_dataplus._M_p);
        delim = psVar5;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
      pFVar6 = extraout_RDX_05;
    }
    if (*(int *)(descriptor + 0x7c) < 1) {
      io::Printer::Print<>(printer,"null, ");
    }
    else {
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (0 < *(int *)(descriptor + 0x7c)) {
        lVar9 = 0;
        lVar7 = 0;
        do {
          GetFullExtensionName_abi_cxx11_
                    (&local_88,(csharp *)(*(long *)(descriptor + 0x50) + lVar9),pFVar6);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_68,
                     &local_88);
          pFVar6 = extraout_RDX_07;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != paVar1) {
            operator_delete(local_88._M_dataplus._M_p);
            pFVar6 = extraout_RDX_08;
          }
          lVar7 = lVar7 + 1;
          lVar9 = lVar9 + 0x98;
        } while (lVar7 < *(int *)(descriptor + 0x7c));
      }
      Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&local_88,(protobuf *)&local_68,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x3b35ec,(char *)delim);
      printer = local_48;
      io::Printer::Print<char[11],std::__cxx11::string>
                (local_48,"new pb::Extension[] { $extensions$ }, ",(char (*) [11])0x39ede2,&local_88
                );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar1) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
    }
    this_00 = local_38;
    if (*(int *)(descriptor + 0x70) < 1) {
      pcVar8 = "null";
    }
    else {
      io::Printer::Print<>(printer,"new pbr::GeneratedClrTypeInfo[] { ");
      uVar2 = (ulong)*(uint *)(descriptor + 0x70);
      pcVar8 = "}";
      if (0 < (int)*(uint *)(descriptor + 0x70)) {
        lVar7 = 0;
        uVar10 = 0;
        do {
          WriteGeneratedCodeInfo
                    (this_00,(Descriptor *)(*(long *)(descriptor + 0x38) + lVar7),printer,
                     uVar10 == (int)uVar2 - 1);
          uVar10 = uVar10 + 1;
          uVar2 = (ulong)*(int *)(descriptor + 0x70);
          lVar7 = lVar7 + 0x90;
        } while ((long)uVar10 < (long)uVar2);
      }
    }
    io::Printer::Print<>(printer,pcVar8);
    pcVar8 = "),\n";
    if ((char)local_3c != '\0') {
      pcVar8 = ")";
    }
  }
  else {
    pcVar8 = "null, ";
  }
  io::Printer::Print<>(printer,pcVar8);
  return;
}

Assistant:

void ReflectionClassGenerator::WriteGeneratedCodeInfo(const Descriptor* descriptor, io::Printer* printer, bool last) {
  if (IsMapEntryMessage(descriptor)) {
    printer->Print("null, ");
    return;
  }
  // Generated message type
  printer->Print("new pbr::GeneratedClrTypeInfo(typeof($type_name$), $type_name$.Parser, ", "type_name", GetClassName(descriptor));

  // Fields
  if (descriptor->field_count() > 0) {
      std::vector<std::string> fields;
      fields.reserve(descriptor->field_count());
      for (int i = 0; i < descriptor->field_count(); i++) {
          fields.push_back(GetPropertyName(descriptor->field(i)));
      }
      printer->Print("new[]{ \"$fields$\" }, ", "fields", Join(fields, "\", \""));
  }
  else {
      printer->Print("null, ");
  }

  // Oneofs
  if (descriptor->oneof_decl_count() > 0) {
      std::vector<std::string> oneofs;
      oneofs.reserve(descriptor->oneof_decl_count());
      for (int i = 0; i < descriptor->oneof_decl_count(); i++) {
          oneofs.push_back(UnderscoresToCamelCase(descriptor->oneof_decl(i)->name(), true));
      }
      printer->Print("new[]{ \"$oneofs$\" }, ", "oneofs", Join(oneofs, "\", \""));
  }
  else {
      printer->Print("null, ");
  }

  // Nested enums
  if (descriptor->enum_type_count() > 0) {
      std::vector<std::string> enums;
      enums.reserve(descriptor->enum_type_count());
      for (int i = 0; i < descriptor->enum_type_count(); i++) {
          enums.push_back(GetClassName(descriptor->enum_type(i)));
      }
      printer->Print("new[]{ typeof($enums$) }, ", "enums", Join(enums, "), typeof("));
  }
  else {
      printer->Print("null, ");
  }

  // Extensions
  if (descriptor->extension_count() > 0) {
    std::vector<std::string> extensions;
    for (int i = 0; i < descriptor->extension_count(); i++) {
      extensions.push_back(GetFullExtensionName(descriptor->extension(i)));
    }
    printer->Print("new pb::Extension[] { $extensions$ }, ", "extensions", Join(extensions, ", "));
  }
  else {
    printer->Print("null, ");
  }

  // Nested types
  if (descriptor->nested_type_count() > 0) {
      // Need to specify array type explicitly here, as all elements may be null.
      printer->Print("new pbr::GeneratedClrTypeInfo[] { ");
      for (int i = 0; i < descriptor->nested_type_count(); i++) {
          WriteGeneratedCodeInfo(descriptor->nested_type(i), printer, i == descriptor->nested_type_count() - 1);
      }
      printer->Print("}");
  }
  else {
      printer->Print("null");
  }
  printer->Print(last ? ")" : "),\n");
}